

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AlignmentRecord.cpp
# Opt level: O0

string * __thiscall AlignmentRecord::getName_abi_cxx11_(AlignmentRecord *this)

{
  string *in_RSI;
  string *in_RDI;
  
  std::__cxx11::string::string((string *)in_RDI,in_RSI);
  return in_RDI;
}

Assistant:

std::string AlignmentRecord::getName() const {
    return name;
}